

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfileio.c
# Opt level: O0

int ffexist(char *infile,int *exists,int *status)

{
  int iVar1;
  char *pcVar2;
  int *in_RDX;
  undefined4 *in_RSI;
  char *ptr1;
  char rootname [1025];
  FILE *diskfile;
  char local_438 [1024];
  char *in_stack_ffffffffffffffc8;
  FILE *local_28;
  int local_4;
  
  if (*in_RDX < 1) {
    ffrtnm((char *)rootname._24_8_,(char *)rootname._16_8_,(int *)rootname._8_8_);
    pcVar2 = strstr(local_438,"://");
    if (((pcVar2 == (char *)0x0) && (local_438[0] != '-')) ||
       (iVar1 = strncmp(local_438,"file",4), iVar1 == 0)) {
      iVar1 = file_openfile((char *)rootname._72_8_,rootname._68_4_,(FILE **)rootname._56_8_);
      if (iVar1 == 0) {
        *in_RSI = 1;
        fclose(local_28);
      }
      else {
        iVar1 = file_is_compressed(in_stack_ffffffffffffffc8);
        if (iVar1 == 0) {
          *in_RSI = 0;
        }
        else {
          *in_RSI = 2;
        }
      }
      local_4 = *in_RDX;
    }
    else {
      *in_RSI = 0xffffffff;
      local_4 = *in_RDX;
    }
  }
  else {
    local_4 = *in_RDX;
  }
  return local_4;
}

Assistant:

int ffexist(const char *infile, /* I - input filename or URL */
            int *exists,        /* O -  2 = a compressed version of file exists */
	                        /*      1 = yes, disk file exists               */
	                        /*      0 = no, disk file could not be found    */
				/*     -1 = infile is not a disk file (could    */
				/*   be a http, ftp, gsiftp, smem, or stdin file) */
            int *status)        /* I/O  status  */

/*
   test if the input file specifier is an existing file on disk
   If the specified file can't be found, it then searches for a 
   compressed version of the file.
*/
{
    FILE *diskfile;
    char rootname[FLEN_FILENAME];
    char *ptr1;
    
    if (*status > 0)
        return(*status);

    /* strip off any extname or filters from the name */
    ffrtnm( (char *)infile, rootname, status);

    ptr1 = strstr(rootname, "://");
    
    if (ptr1 || *rootname == '-') {
        if (!strncmp(rootname, "file", 4) ) {
	    ptr1 = ptr1 + 3;   /* pointer to start of the disk file name */
	} else {
	    *exists = -1;   /* this is not a disk file */
	    return (*status);
	}
    } else {
        ptr1 = rootname;
    }
    
    /* see if the disk file exists */
    if (file_openfile(ptr1, 0, &diskfile)) {
    
        /* no, couldn't open file, so see if there is a compressed version */
        if (file_is_compressed(ptr1) ) {
           *exists = 2;  /* a compressed version of the file exists */
        } else {
	   *exists = 0;  /* neither file nor compressed version exist */
	}
	
    } else {
    
        /* yes, file exists */
        *exists = 1; 
	fclose(diskfile);
    }
    	   
    return(*status);
}